

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

float lapv(qnode_ptr_t p,int x,int y)

{
  float d;
  int y_local;
  int x_local;
  qnode_ptr_t p_local;
  
  return ((*p->flow_ptr)[p->res * (x + -1) + y].y + (*p->flow_ptr)[p->res * (x + 1) + y].y +
          (*p->flow_ptr)[p->res * x + y + -1].y + (*p->flow_ptr)[p->res * x + y + 1].y) * 0.16666667
         + ((*p->flow_ptr)[p->res * (x + -1) + y + -1].y +
            (*p->flow_ptr)[p->res * (x + -1) + y + 1].y +
            (*p->flow_ptr)[p->res * (x + 1) + y + -1].y + (*p->flow_ptr)[p->res * (x + 1) + y + 1].y
           ) * 0.083333336;
}

Assistant:

float lapv(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ float d ;

  d = (1.0/6.0)*((*p->flow_ptr)[p->res*(x-1) + y].y +
  (*p->flow_ptr)[p->res*(x+1) + y].y +
  (*p->flow_ptr)[p->res*x + (y-1)].y +
  (*p->flow_ptr)[p->res*x + (y+1)].y) +
  (1.0/12.0)*((*p->flow_ptr)[p->res*(x-1) + y-1].y +
  (*p->flow_ptr)[p->res*(x-1) + y+1].y +
  (*p->flow_ptr)[p->res*(x+1) + y-1].y +
  (*p->flow_ptr)[p->res*(x+1) + y+1].y) ;
  return(d) ;
}